

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O1

void PAL_TerminateEx(int exitCode)

{
  if (PAL_InitializeChakraCoreCalled) {
    if (init_critsec == (PCRITICAL_SECTION)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_TerminateEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
              ,0x251);
      fprintf(_stderr,"PAL_Initialize has never been called!\n");
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c108;
    }
    shutdown_intent.m_val = 1;
    if (PAL_InitializeChakraCoreCalled != false) {
      exit(exitCode);
    }
  }
LAB_0012c108:
  abort();
}

Assistant:

void
PALAPI
PAL_TerminateEx(
    int exitCode)
{
    ENTRY_EXTERNAL("PAL_TerminateEx()\n");

    if (NULL == init_critsec)
    {
        /* note that these macros probably won't output anything, since the
        debug channels haven't been initialized yet */
        ASSERT("PAL_Initialize has never been called!\n");
        LOGEXIT("PAL_Terminate returns.\n");
    }

    PALSetShutdownIntent();

    LOGEXIT("PAL_TerminateEx is exiting the current process.\n");
    exit(exitCode);
}